

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O1

VkResult __thiscall
myvk::CommandBuffer::Submit
          (CommandBuffer *this,SemaphoreStageGroup *wait_semaphores,
          SemaphoreGroup *signal_semaphores,Ptr<Fence> *fence)

{
  pointer ppVVar1;
  element_type *peVar2;
  int iVar3;
  VkResult VVar4;
  ulong uVar5;
  VkFence pVVar6;
  pthread_mutex_t *__mutex;
  VkSubmitInfo info;
  VkSubmitInfo local_68;
  
  local_68.pNext = (void *)0x0;
  local_68.pWaitDstStageMask = (pointer)0x0;
  local_68._56_8_ = 0;
  local_68._16_8_ = 0;
  local_68.pWaitSemaphores = (pointer)0x0;
  local_68.pSignalSemaphores = (pointer)0x0;
  local_68.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  local_68._4_4_ = 0;
  local_68.commandBufferCount = 1;
  local_68._44_4_ = 0;
  local_68.pCommandBuffers = &this->m_command_buffer;
  ppVVar1 = (wait_semaphores->m_semaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(wait_semaphores->m_semaphores).
                        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3;
  if ((int)uVar5 != 0) {
    local_68._16_8_ = uVar5 & 0xffffffff;
    local_68.pWaitDstStageMask =
         (wait_semaphores->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68.pWaitSemaphores = ppVVar1;
  }
  ppVVar1 = (signal_semaphores->m_semaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(signal_semaphores->m_semaphores).
                        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3;
  if ((int)uVar5 != 0) {
    local_68._56_8_ = uVar5 & 0xffffffff;
    local_68.pSignalSemaphores = ppVVar1;
  }
  __mutex = (pthread_mutex_t *)
            &((((((this->m_command_pool_ptr).
                  super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_unique_queue_ptr).super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_mutex;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    peVar2 = (fence->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      pVVar6 = (VkFence)0x0;
    }
    else {
      pVVar6 = peVar2->m_fence;
    }
    VVar4 = (*vkQueueSubmit)(((((((this->m_command_pool_ptr).
                                  super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->m_queue_ptr).
                                super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_unique_queue_ptr).
                              super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->m_queue,1,&local_68,pVVar6);
    pthread_mutex_unlock(__mutex);
    return VVar4;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

VkResult CommandBuffer::Submit(const SemaphoreStageGroup &wait_semaphores, const SemaphoreGroup &signal_semaphores,
                               const Ptr<Fence> &fence) const {
	VkSubmitInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;

	info.commandBufferCount = 1;
	info.pCommandBuffers = &m_command_buffer;

	if (wait_semaphores.GetCount()) {
		info.waitSemaphoreCount = wait_semaphores.GetCount();
		info.pWaitSemaphores = wait_semaphores.GetSemaphoresPtr();
		info.pWaitDstStageMask = wait_semaphores.GetWaitStagesPtr();
	}

	if (signal_semaphores.GetCount()) {
		info.signalSemaphoreCount = signal_semaphores.GetCount();
		info.pSignalSemaphores = signal_semaphores.GetSemaphoresPtr();
	}

	std::lock_guard<std::mutex> lock_guard{m_command_pool_ptr->GetQueuePtr()->GetMutex()};
	return vkQueueSubmit(m_command_pool_ptr->GetQueuePtr()->GetHandle(), 1, &info,
	                     fence ? fence->GetHandle() : VK_NULL_HANDLE);
}